

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void Wavegeneral_h(Mat *a,int JJ,int n,int isign,double *P,double *Q,int fsize)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  long lVar10;
  int k;
  int iVar11;
  ulong uVar12;
  double dVar13;
  undefined8 uVar14;
  double dVar15;
  
  if (fsize <= n) {
    iVar11 = n >> 1;
    if (isign < 0) {
      iVar5 = iVar11 + fsize / -2;
      iVar1 = *(int *)(a + 0xc);
      lVar3 = *(long *)(a + 0x10);
      plVar8 = *(long **)(a + 0x48);
      for (lVar10 = 0; iVar5 = iVar5 + 1, lVar10 < n; lVar10 = lVar10 + 2) {
        (Wavegeneral_h::b + lVar10)[0] = 0.0;
        (Wavegeneral_h::b + lVar10)[1] = 0.0;
        uVar14 = 0;
        iVar6 = iVar5;
        for (uVar9 = (ulong)(uint)fsize; 1 < (int)uVar9; uVar9 = uVar9 - 2) {
          lVar2 = *plVar8 * (long)JJ + lVar3;
          iVar4 = (int)((long)((ulong)(uint)((int)((long)iVar6 % (long)iVar1) >> 0x1f) << 0x20 |
                              (long)iVar6 % (long)iVar1 & 0xffffffffU) % (long)iVar11);
          dVar13 = (double)*(float *)(lVar2 + (long)iVar4 * 4);
          dVar15 = (double)*(float *)(lVar2 + (long)(iVar4 + iVar11) * 4);
          uVar14 = CONCAT44((float)(dVar13 * (P + (uVar9 - 2))[1] + dVar15 * (Q + (uVar9 - 2))[1] +
                                   (double)(float)((ulong)uVar14 >> 0x20)),
                            (float)(dVar13 * P[uVar9 - 2] + dVar15 * Q[uVar9 - 2] +
                                   (double)(float)uVar14));
          *(undefined8 *)(Wavegeneral_h::b + lVar10) = uVar14;
          iVar6 = iVar6 + 1;
        }
      }
    }
    else {
      lVar3 = *(long *)(a + 0x10);
      plVar8 = *(long **)(a + 0x48);
      uVar7 = 0;
      uVar9 = (ulong)(uint)fsize;
      if (fsize < 1) {
        uVar9 = uVar7;
      }
      lVar10 = 0;
      for (; (long)uVar7 < (long)n; uVar7 = uVar7 + 2) {
        Wavegeneral_h::b[lVar10] = 0.0;
        lVar2 = iVar11 + lVar10;
        Wavegeneral_h::b[lVar2] = 0.0;
        for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          dVar13 = (double)*(float *)(*plVar8 * (long)JJ + lVar3 +
                                     ((long)((int)uVar7 + (int)uVar12) % (long)n & 0xffffffffU) * 4)
          ;
          Wavegeneral_h::b[lVar10] = (float)(P[uVar12] * dVar13 + (double)Wavegeneral_h::b[lVar10]);
          Wavegeneral_h::b[lVar2] = (float)(dVar13 * Q[uVar12] + (double)Wavegeneral_h::b[lVar2]);
        }
        lVar10 = lVar10 + 1;
      }
    }
    uVar7 = 0;
    uVar9 = (ulong)(uint)n;
    if (n < 1) {
      uVar9 = uVar7;
    }
    for (; uVar9 * 4 != uVar7; uVar7 = uVar7 + 4) {
      *(undefined4 *)(uVar7 + *plVar8 * (long)JJ + lVar3) =
           *(undefined4 *)((long)Wavegeneral_h::b + uVar7);
    }
  }
  return;
}

Assistant:

static void 
Wavegeneral_h(cv::Mat& a, int JJ, int n, int isign, double *P, double *Q, int fsize)
{
  static float b[1024];
	
  if (n < fsize) return;
  int nh = n >> 1;
	
  if (isign >= 0) 
  {
    for (int i = 0,j = 0; j < n; j+=2, ++i) 
    {
      b[i]=0.0f; b[i+nh]=0.0f;
      for(int k = 0;k < fsize; ++k) 
      {
        b[i] += P[k] * a.at<float>(JJ, (j+k)%n);
        b[i+nh] += Q[k] * a.at<float>(JJ, (j+k)%n);
      }
    }
  } 
  else 
  {
    for (int i = 0, r = nh-(fsize/2-1); i < n; r+=1, i+=2) 
    {
      b[i]=0.0f;
      b[i+1]=0.0f;
			
      for(int k = fsize-2, j = 0; k >= 0; k-=2, j+=1) 
      {
        b[i] += P[k] * a.at<float>(JJ, ((r+j)%a.cols)%nh) + Q[k] * a.at<float>(JJ, nh+((r+j)%a.cols)%nh);
        b[i+1] += P[k+1] * a.at<float>(JJ, ((r+j)%a.cols)%nh) + Q[k+1] * a.at<float>(JJ, nh+((r+j)%a.cols)%nh);
      }
    }
  }
	
  for(int i = 0; i < n; ++i)
    a.at<float>(JJ, i) = b[i];
}